

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvmapImage.cpp
# Opt level: O2

void __thiscall EnvmapImage::clear(EnvmapImage *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Rgba *pRVar5;
  long lVar6;
  int x;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  iVar1 = (this->_dataWindow).max.x;
  iVar2 = (this->_dataWindow).min.x;
  iVar3 = (this->_dataWindow).max.y;
  iVar4 = (this->_dataWindow).min.y;
  lVar9 = 0;
  for (lVar6 = 0; lVar6 <= (long)iVar3 - (long)iVar4; lVar6 = lVar6 + 1) {
    lVar8 = 6;
    for (lVar7 = 0; lVar7 <= (long)iVar1 - (long)iVar2; lVar7 = lVar7 + 1) {
      lVar10 = (this->_pixels)._sizeY * lVar9;
      pRVar5 = (this->_pixels)._data;
      Imath_3_2::half::operator=((half *)((long)pRVar5 + lVar8 + lVar10 + -6),0.0);
      Imath_3_2::half::operator=((half *)((long)pRVar5 + lVar8 + lVar10 + -4),0.0);
      Imath_3_2::half::operator=((half *)((long)pRVar5 + lVar8 + lVar10 + -2),0.0);
      Imath_3_2::half::operator=((half *)((long)&(pRVar5->r)._h + lVar8 + lVar10),0.0);
      lVar8 = lVar8 + 8;
    }
    lVar9 = lVar9 + 8;
  }
  return;
}

Assistant:

void
EnvmapImage::clear ()
{
    int w = _dataWindow.max.x - _dataWindow.min.x + 1;
    int h = _dataWindow.max.y - _dataWindow.min.y + 1;

    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            Rgba& p = _pixels[y][x];

            p.r = 0;
            p.g = 0;
            p.b = 0;
            p.a = 0;
        }
    }
}